

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

BaseType spirv_cross::to_unsigned_basetype(uint32_t width)

{
  CompilerError *this;
  allocator local_31;
  string local_30 [32];
  uint32_t local_10;
  BaseType local_c;
  uint32_t width_local;
  
  if (width == 8) {
    local_c = UByte;
  }
  else if (width == 0x10) {
    local_c = UShort;
  }
  else if (width == 0x20) {
    local_c = UInt;
  }
  else {
    if (width != 0x40) {
      local_10 = width;
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_30,"Invalid bit width.",&local_31);
      CompilerError::CompilerError(this,(string *)local_30);
      __cxa_throw(this,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_c = UInt64;
  }
  return local_c;
}

Assistant:

static inline SPIRType::BaseType to_unsigned_basetype(uint32_t width)
{
	switch (width)
	{
	case 8:
		return SPIRType::UByte;
	case 16:
		return SPIRType::UShort;
	case 32:
		return SPIRType::UInt;
	case 64:
		return SPIRType::UInt64;
	default:
		SPIRV_CROSS_THROW("Invalid bit width.");
	}
}